

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
          (QHash<FileInfoCacheKey,QFileInfo> *this,FileInfoCacheKey *key,QFileInfo *args)

{
  long in_FS_OFFSET;
  piter pVar1;
  FileInfoCacheKey copy;
  FileInfoCacheKey local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.pwd.d.size = -0x5555555555555556;
  local_58.pwd.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.pwd.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_58.file.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_58.file.d.size = -0x5555555555555556;
  local_58.hash = 0xaaaaaaaaaaaaaaaa;
  local_58.file.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  FileInfoCacheKey::FileInfoCacheKey(&local_58,key);
  pVar1 = (piter)emplace<QFileInfo_const&>(this,&local_58,args);
  FileInfoCacheKey::~FileInfoCacheKey(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }